

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

vector<AddedNodeInfo,_std::allocator<AddedNodeInfo>_> * __thiscall
CConnman::GetAddedNodeInfo(CConnman *this,bool include_connected)

{
  __normal_iterator<const_AddedNodeParams_*,_std::vector<AddedNodeParams,_std::allocator<AddedNodeParams>_>_>
  __first;
  bool bVar1;
  back_insert_iterator<std::__cxx11::list<AddedNodeParams,_std::allocator<AddedNodeParams>_>_> bVar2
  ;
  AnnotatedMixin<std::recursive_mutex> *pAVar3;
  pointer ppVar4;
  pointer ppVar5;
  byte in_DL;
  vector<AddedNodeInfo,_std::allocator<AddedNodeInfo>_> *in_RDI;
  long in_FS_OFFSET;
  AddedNodeParams *addr;
  list<AddedNodeParams,_std::allocator<AddedNodeParams>_> *__range1_1;
  CNode *pnode;
  vector<CNode_*,_std::allocator<CNode_*>_> *__range1;
  vector<AddedNodeInfo,_std::allocator<AddedNodeInfo>_> *ret;
  iterator it_1;
  iterator it;
  iterator __end1_1;
  iterator __begin1_1;
  const_iterator __end1;
  const_iterator __begin1;
  list<AddedNodeParams,_std::allocator<AddedNodeParams>_> lAddresses;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock81;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock80;
  AddedNodeInfo addedNode;
  CService service;
  string addrName;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_CService>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_CService>_>_>_>
  mapConnectedByName;
  map<CService,_bool,_std::less<CService>,_std::allocator<std::pair<const_CService,_bool>_>_>
  mapConnected;
  CNode *in_stack_fffffffffffffce8;
  iterator in_stack_fffffffffffffcf0;
  iterator in_stack_fffffffffffffcf8;
  undefined7 in_stack_fffffffffffffd00;
  undefined1 in_stack_fffffffffffffd07;
  key_type *in_stack_fffffffffffffd08;
  allocator_type *in_stack_fffffffffffffd10;
  undefined6 in_stack_fffffffffffffd18;
  undefined2 in_stack_fffffffffffffd1e;
  __normal_iterator<const_AddedNodeParams_*,_std::vector<AddedNodeParams,_std::allocator<AddedNodeParams>_>_>
  in_stack_fffffffffffffd20;
  undefined7 in_stack_fffffffffffffd28;
  undefined1 in_stack_fffffffffffffd2f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd30;
  undefined6 in_stack_fffffffffffffd38;
  byte in_stack_fffffffffffffd3e;
  undefined1 in_stack_fffffffffffffd3f;
  key_type local_160 [2];
  undefined1 local_110;
  byte local_10f;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::vector<AddedNodeInfo,_std::allocator<AddedNodeInfo>_>::vector
            ((vector<AddedNodeInfo,_std::allocator<AddedNodeInfo>_> *)in_stack_fffffffffffffce8);
  std::allocator<AddedNodeParams>::allocator
            ((allocator<AddedNodeParams> *)in_stack_fffffffffffffce8);
  std::__cxx11::list<AddedNodeParams,_std::allocator<AddedNodeParams>_>::list
            ((list<AddedNodeParams,_std::allocator<AddedNodeParams>_> *)
             in_stack_fffffffffffffd20._M_current,
             CONCAT26(in_stack_fffffffffffffd1e,in_stack_fffffffffffffd18),in_stack_fffffffffffffd10
            );
  std::allocator<AddedNodeParams>::~allocator
            ((allocator<AddedNodeParams> *)in_stack_fffffffffffffce8);
  MaybeCheckNotHeld((Mutex *)in_stack_fffffffffffffce8);
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)
             CONCAT17(in_stack_fffffffffffffd2f,in_stack_fffffffffffffd28),
             (AnnotatedMixin<std::mutex> *)in_stack_fffffffffffffd20._M_current,
             (char *)CONCAT26(in_stack_fffffffffffffd1e,in_stack_fffffffffffffd18),
             (char *)in_stack_fffffffffffffd10,(int)((ulong)in_stack_fffffffffffffd08 >> 0x20),
             SUB81((ulong)in_stack_fffffffffffffd08 >> 0x18,0));
  std::vector<AddedNodeParams,_std::allocator<AddedNodeParams>_>::size
            ((vector<AddedNodeParams,_std::allocator<AddedNodeParams>_> *)in_stack_fffffffffffffce8)
  ;
  std::vector<AddedNodeInfo,_std::allocator<AddedNodeInfo>_>::reserve
            ((vector<AddedNodeInfo,_std::allocator<AddedNodeInfo>_> *)
             CONCAT17(in_stack_fffffffffffffd2f,in_stack_fffffffffffffd28),
             (size_type)in_stack_fffffffffffffd20._M_current);
  std::vector<AddedNodeParams,_std::allocator<AddedNodeParams>_>::cbegin
            ((vector<AddedNodeParams,_std::allocator<AddedNodeParams>_> *)
             in_stack_fffffffffffffcf0._M_node);
  std::vector<AddedNodeParams,_std::allocator<AddedNodeParams>_>::cend
            ((vector<AddedNodeParams,_std::allocator<AddedNodeParams>_> *)
             in_stack_fffffffffffffcf0._M_node);
  std::back_inserter<std::__cxx11::list<AddedNodeParams,std::allocator<AddedNodeParams>>>
            ((list<AddedNodeParams,_std::allocator<AddedNodeParams>_> *)
             in_stack_fffffffffffffcf0._M_node);
  __first._M_current._7_1_ = in_stack_fffffffffffffd2f;
  __first._M_current._0_7_ = in_stack_fffffffffffffd28;
  bVar2.container._6_2_ = in_stack_fffffffffffffd1e;
  bVar2.container._0_6_ = in_stack_fffffffffffffd18;
  bVar2 = std::
          copy<__gnu_cxx::__normal_iterator<AddedNodeParams_const*,std::vector<AddedNodeParams,std::allocator<AddedNodeParams>>>,std::back_insert_iterator<std::__cxx11::list<AddedNodeParams,std::allocator<AddedNodeParams>>>>
                    (__first,in_stack_fffffffffffffd20,bVar2);
  UniqueLock<AnnotatedMixin<std::mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)in_stack_fffffffffffffce8);
  std::map<CService,_bool,_std::less<CService>,_std::allocator<std::pair<const_CService,_bool>_>_>::
  map((map<CService,_bool,_std::less<CService>,_std::allocator<std::pair<const_CService,_bool>_>_> *
      )in_stack_fffffffffffffce8);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_CService>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_CService>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_CService>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_CService>_>_>_>
         *)in_stack_fffffffffffffce8);
  pAVar3 = MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
                     ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffffce8);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
             CONCAT17(in_stack_fffffffffffffd2f,in_stack_fffffffffffffd28),
             (AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffffd20._M_current,
             (char *)CONCAT26(in_stack_fffffffffffffd1e,in_stack_fffffffffffffd18),
             (char *)in_stack_fffffffffffffd10,(int)((ulong)in_stack_fffffffffffffd08 >> 0x20),
             SUB81((ulong)in_stack_fffffffffffffd08 >> 0x18,0));
  std::vector<CNode_*,_std::allocator<CNode_*>_>::begin
            ((vector<CNode_*,_std::allocator<CNode_*>_> *)in_stack_fffffffffffffcf0._M_node);
  std::vector<CNode_*,_std::allocator<CNode_*>_>::end
            ((vector<CNode_*,_std::allocator<CNode_*>_> *)in_stack_fffffffffffffcf0._M_node);
  while (bVar1 = __gnu_cxx::
                 operator==<CNode_*const_*,_std::vector<CNode_*,_std::allocator<CNode_*>_>_>
                           ((__normal_iterator<CNode_*const_*,_std::vector<CNode_*,_std::allocator<CNode_*>_>_>
                             *)in_stack_fffffffffffffcf8._M_node,
                            (__normal_iterator<CNode_*const_*,_std::vector<CNode_*,_std::allocator<CNode_*>_>_>
                             *)in_stack_fffffffffffffcf0._M_node), ((bVar1 ^ 0xffU) & 1) != 0) {
    __gnu_cxx::__normal_iterator<CNode_*const_*,_std::vector<CNode_*,_std::allocator<CNode_*>_>_>::
    operator*((__normal_iterator<CNode_*const_*,_std::vector<CNode_*,_std::allocator<CNode_*>_>_> *)
              in_stack_fffffffffffffce8);
    in_stack_fffffffffffffd3f =
         CNetAddr::IsValid((CNetAddr *)CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00)
                          );
    if ((bool)in_stack_fffffffffffffd3f) {
      in_stack_fffffffffffffd3e = CNode::IsInboundConn(in_stack_fffffffffffffce8);
      in_stack_fffffffffffffd30 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           map<CService,_bool,_std::less<CService>,_std::allocator<std::pair<const_CService,_bool>_>_>
           ::operator[]((map<CService,_bool,_std::less<CService>,_std::allocator<std::pair<const_CService,_bool>_>_>
                         *)in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
      *(byte *)&(in_stack_fffffffffffffd30->_M_dataplus)._M_p = in_stack_fffffffffffffd3e & 1;
    }
    std::__cxx11::string::string
              (in_stack_fffffffffffffd30,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffd2f,in_stack_fffffffffffffd28));
    bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffce8);
    if (!bVar1) {
      in_stack_fffffffffffffd2f = CNode::IsInboundConn(in_stack_fffffffffffffce8);
      std::make_pair<bool,CService_const&>
                ((bool *)in_stack_fffffffffffffcf0._M_node,(CService *)in_stack_fffffffffffffce8);
      in_stack_fffffffffffffd20._M_current =
           (AddedNodeParams *)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_CService>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_CService>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_CService>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_CService>_>_>_>
                         *)in_stack_fffffffffffffd10,(key_type *)in_stack_fffffffffffffd08);
      std::pair<bool,_CService>::operator=
                ((pair<bool,_CService> *)in_stack_fffffffffffffcf8._M_node,
                 (type)in_stack_fffffffffffffcf0._M_node);
      std::pair<bool,_CService>::~pair((pair<bool,_CService> *)in_stack_fffffffffffffce8);
    }
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffce8);
    __gnu_cxx::__normal_iterator<CNode_*const_*,_std::vector<CNode_*,_std::allocator<CNode_*>_>_>::
    operator++((__normal_iterator<CNode_*const_*,_std::vector<CNode_*,_std::allocator<CNode_*>_>_> *
               )in_stack_fffffffffffffce8);
  }
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffffce8);
  std::__cxx11::list<AddedNodeParams,_std::allocator<AddedNodeParams>_>::begin
            ((list<AddedNodeParams,_std::allocator<AddedNodeParams>_> *)
             in_stack_fffffffffffffcf0._M_node);
  std::__cxx11::list<AddedNodeParams,_std::allocator<AddedNodeParams>_>::end
            ((list<AddedNodeParams,_std::allocator<AddedNodeParams>_> *)
             in_stack_fffffffffffffcf0._M_node);
  do {
    bVar1 = std::operator==((_Self *)in_stack_fffffffffffffcf8._M_node,
                            (_Self *)in_stack_fffffffffffffcf0._M_node);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_CService>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_CService>_>_>_>
      ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_CService>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_CService>_>_>_>
              *)in_stack_fffffffffffffce8);
      std::
      map<CService,_bool,_std::less<CService>,_std::allocator<std::pair<const_CService,_bool>_>_>::
      ~map((map<CService,_bool,_std::less<CService>,_std::allocator<std::pair<const_CService,_bool>_>_>
            *)in_stack_fffffffffffffce8);
      std::__cxx11::list<AddedNodeParams,_std::allocator<AddedNodeParams>_>::~list
                ((list<AddedNodeParams,_std::allocator<AddedNodeParams>_> *)
                 in_stack_fffffffffffffce8);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        return in_RDI;
      }
      __stack_chk_fail();
    }
    std::_List_iterator<AddedNodeParams>::operator*
              ((_List_iterator<AddedNodeParams> *)in_stack_fffffffffffffce8);
    GetDefaultPort((CConnman *)CONCAT17(in_stack_fffffffffffffd2f,in_stack_fffffffffffffd28),
                   &(in_stack_fffffffffffffd20._M_current)->m_added_node);
    std::
    function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
    ::function((function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
                *)in_stack_fffffffffffffd08,
               (function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
                *)CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00));
    LookupNumeric((string *)bVar2.container,(uint16_t)((ulong)pAVar3 >> 0x30),
                  (DNSLookupFn *)
                  CONCAT17(in_stack_fffffffffffffd3f,
                           CONCAT16(in_stack_fffffffffffffd3e,in_stack_fffffffffffffd38)));
    MaybeFlipIPv6toCJDNS((CService *)in_stack_fffffffffffffd20._M_current);
    CService::~CService((CService *)in_stack_fffffffffffffce8);
    std::
    function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
    ::~function((function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
                 *)in_stack_fffffffffffffce8);
    in_stack_fffffffffffffd08 = local_160;
    AddedNodeParams::AddedNodeParams
              ((AddedNodeParams *)in_stack_fffffffffffffcf8._M_node,
               (AddedNodeParams *)in_stack_fffffffffffffcf0._M_node);
    CService::CService((CService *)in_stack_fffffffffffffce8);
    local_110 = 0;
    local_10f = 0;
    in_stack_fffffffffffffd07 =
         CNetAddr::IsValid((CNetAddr *)CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00)
                          );
    if ((bool)in_stack_fffffffffffffd07) {
      in_stack_fffffffffffffcf8 =
           std::
           map<CService,_bool,_std::less<CService>,_std::allocator<std::pair<const_CService,_bool>_>_>
           ::find(in_stack_fffffffffffffcf0._M_node,(key_type *)in_stack_fffffffffffffce8);
      std::
      map<CService,_bool,_std::less<CService>,_std::allocator<std::pair<const_CService,_bool>_>_>::
      end((map<CService,_bool,_std::less<CService>,_std::allocator<std::pair<const_CService,_bool>_>_>
           *)in_stack_fffffffffffffcf0._M_node);
      bVar1 = std::operator==((_Self *)in_stack_fffffffffffffcf8._M_node,
                              (_Self *)in_stack_fffffffffffffcf0._M_node);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        if ((in_DL & 1) == 0) goto LAB_00218dd4;
        CService::operator=((CService *)in_stack_fffffffffffffcf8._M_node,
                            (CService *)in_stack_fffffffffffffcf0._M_node);
        local_110 = 1;
        ppVar4 = std::_Rb_tree_iterator<std::pair<const_CService,_bool>_>::operator->
                           ((_Rb_tree_iterator<std::pair<const_CService,_bool>_> *)
                            in_stack_fffffffffffffce8);
        local_10f = ppVar4->second & 1;
      }
LAB_00218db2:
      std::vector<AddedNodeInfo,_std::allocator<AddedNodeInfo>_>::emplace_back<AddedNodeInfo>
                ((vector<AddedNodeInfo,_std::allocator<AddedNodeInfo>_> *)in_stack_fffffffffffffd08,
                 (AddedNodeInfo *)CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00));
    }
    else {
      in_stack_fffffffffffffcf0 =
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_CService>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_CService>_>_>_>
           ::find(in_stack_fffffffffffffcf0._M_node,(key_type *)in_stack_fffffffffffffce8);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_CService>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_CService>_>_>_>
      ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_CService>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_CService>_>_>_>
             *)in_stack_fffffffffffffcf0._M_node);
      bVar1 = std::operator==((_Self *)in_stack_fffffffffffffcf8._M_node,
                              (_Self *)in_stack_fffffffffffffcf0._M_node);
      if (((bVar1 ^ 0xffU) & 1) == 0) goto LAB_00218db2;
      if ((in_DL & 1) != 0) {
        std::
        _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_CService>_>_>
        ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_CService>_>_>
                      *)in_stack_fffffffffffffce8);
        CService::operator=((CService *)in_stack_fffffffffffffcf8._M_node,
                            (CService *)in_stack_fffffffffffffcf0._M_node);
        local_110 = 1;
        ppVar5 = std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_CService>_>_>
                 ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_CService>_>_>
                               *)in_stack_fffffffffffffce8);
        local_10f = (ppVar5->second).first & 1;
        goto LAB_00218db2;
      }
    }
LAB_00218dd4:
    AddedNodeInfo::~AddedNodeInfo((AddedNodeInfo *)in_stack_fffffffffffffce8);
    CService::~CService((CService *)in_stack_fffffffffffffce8);
    std::_List_iterator<AddedNodeParams>::operator++
              ((_List_iterator<AddedNodeParams> *)in_stack_fffffffffffffce8);
  } while( true );
}

Assistant:

std::vector<AddedNodeInfo> CConnman::GetAddedNodeInfo(bool include_connected) const
{
    std::vector<AddedNodeInfo> ret;

    std::list<AddedNodeParams> lAddresses(0);
    {
        LOCK(m_added_nodes_mutex);
        ret.reserve(m_added_node_params.size());
        std::copy(m_added_node_params.cbegin(), m_added_node_params.cend(), std::back_inserter(lAddresses));
    }


    // Build a map of all already connected addresses (by IP:port and by name) to inbound/outbound and resolved CService
    std::map<CService, bool> mapConnected;
    std::map<std::string, std::pair<bool, CService>> mapConnectedByName;
    {
        LOCK(m_nodes_mutex);
        for (const CNode* pnode : m_nodes) {
            if (pnode->addr.IsValid()) {
                mapConnected[pnode->addr] = pnode->IsInboundConn();
            }
            std::string addrName{pnode->m_addr_name};
            if (!addrName.empty()) {
                mapConnectedByName[std::move(addrName)] = std::make_pair(pnode->IsInboundConn(), static_cast<const CService&>(pnode->addr));
            }
        }
    }

    for (const auto& addr : lAddresses) {
        CService service{MaybeFlipIPv6toCJDNS(LookupNumeric(addr.m_added_node, GetDefaultPort(addr.m_added_node)))};
        AddedNodeInfo addedNode{addr, CService(), false, false};
        if (service.IsValid()) {
            // strAddNode is an IP:port
            auto it = mapConnected.find(service);
            if (it != mapConnected.end()) {
                if (!include_connected) {
                    continue;
                }
                addedNode.resolvedAddress = service;
                addedNode.fConnected = true;
                addedNode.fInbound = it->second;
            }
        } else {
            // strAddNode is a name
            auto it = mapConnectedByName.find(addr.m_added_node);
            if (it != mapConnectedByName.end()) {
                if (!include_connected) {
                    continue;
                }
                addedNode.resolvedAddress = it->second.second;
                addedNode.fConnected = true;
                addedNode.fInbound = it->second.first;
            }
        }
        ret.emplace_back(std::move(addedNode));
    }

    return ret;
}